

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O0

void __thiscall
QAnimationGroup::removeAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  QAnimationGroupPrivate *this_00;
  qsizetype qVar1;
  long in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  QAnimationGroupPrivate *d;
  char *in_stack_ffffffffffffff88;
  QAbstractAnimation **in_stack_ffffffffffffff98;
  int index_00;
  QAnimationGroup *in_stack_ffffffffffffffb0;
  QMessageLogger local_30;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = in_RDI;
  local_10 = in_RSI;
  this_00 = d_func((QAnimationGroup *)0x67ba9f);
  index_00 = (int)((ulong)qVar1 >> 0x20);
  if (local_10 == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_stack_ffffffffffffff98,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff88);
    QMessageLogger::warning(&local_30,"QAnimationGroup::remove: cannot remove null animation");
  }
  else {
    qVar1 = QListSpecialMethodsBase<QAbstractAnimation*>::indexOf<QAbstractAnimation*>
                      ((QListSpecialMethodsBase<QAbstractAnimation_*> *)this_00,
                       in_stack_ffffffffffffff98,in_RDI);
    if (qVar1 == -1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)0xffffffffffffffff,(int)((ulong)in_RDI >> 0x20),
                 in_stack_ffffffffffffff88);
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffffb0,
                 "QAnimationGroup::remove: animation is not part of this group");
    }
    else {
      takeAnimation(in_stack_ffffffffffffffb0,index_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationGroup::removeAnimation(QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (!animation) {
        qWarning("QAnimationGroup::remove: cannot remove null animation");
        return;
    }
    qsizetype index = d->animations.indexOf(animation);
    if (index == -1) {
        qWarning("QAnimationGroup::remove: animation is not part of this group");
        return;
    }

    takeAnimation(index);
}